

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditor::RenderImagesList(CEditor *this,CUIRect ToolBox)

{
  CEditorImage **pID;
  uint uVar1;
  long lVar2;
  CLayerGroup *pCVar3;
  CLayer *pCVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  char *pText;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_68;
  undefined8 local_64;
  float local_5c;
  CUIRect Slot;
  CUIRect ToolBox_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  fVar17 = (float)(this->m_Map).m_lImages.num_elements * 14.0 + 40.0 + 17.0;
  ToolBox_local.h = ToolBox.h;
  fVar16 = fVar17 - ToolBox_local.h;
  ToolBox_local = ToolBox;
  if (fVar16 <= 0.0) {
    fVar16 = 0.0;
    RenderImagesList::s_ScrollValue = 0.0;
  }
  else {
    CUIRect::VSplitRight(&ToolBox_local,15.0,&ToolBox_local,&Slot);
    CUIRect::VSplitRight(&ToolBox_local,3.0,&ToolBox_local,(CUIRect *)0x0);
    RenderImagesList::s_ScrollValue =
         CUI::DoScrollbarV(&this->m_UI,&RenderImagesList::s_ScrollValue,&Slot,
                           RenderImagesList::s_ScrollValue);
    bVar5 = CUIRect::Inside(&Slot,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
    if ((bVar5) ||
       (bVar5 = CUIRect::Inside(&ToolBox_local,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY), bVar5))
    {
      iVar10 = (int)((fVar17 - ToolBox_local.h) / 14.0);
      if (-1 < iVar10) {
        iVar10 = iVar10 + 1;
        iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a4,0);
        if ((char)iVar8 != '\0') {
          fVar15 = RenderImagesList::s_ScrollValue - 1.0 / (float)iVar10;
          fVar18 = 1.0;
          if (fVar15 <= 1.0) {
            fVar18 = fVar15;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar18);
        }
        iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x1a5,0);
        if ((char)iVar8 != '\0') {
          fVar15 = 1.0 / (float)iVar10 + RenderImagesList::s_ScrollValue;
          fVar18 = 1.0;
          if (fVar15 <= 1.0) {
            fVar18 = fVar15;
          }
          RenderImagesList::s_ScrollValue = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar18);
        }
      }
    }
  }
  fVar17 = (RenderImagesList::s_ScrollValue + -1.0) * fVar16 + fVar17;
  if (15.0 <= fVar17) {
    fVar16 = fVar16 * RenderImagesList::s_ScrollValue;
    fVar18 = 0.0;
    fVar15 = 15.0;
    bVar7 = true;
    bVar5 = true;
    do {
      bVar6 = bVar7;
      if (fVar16 <= fVar18) {
        CUIRect::HSplitTop(&ToolBox_local,15.0,&Slot,&ToolBox_local);
        pText = "External";
        if (bVar6) {
          pText = "Embedded";
        }
        CUI::DoLabel(&this->m_UI,&Slot,pText,12.0,1,-1.0,true);
      }
      if (0 < (this->m_Map).m_lImages.num_elements) {
        uVar14 = 0;
        fVar18 = fVar15;
        do {
          iVar10 = (this->m_Map).m_lImages.list[uVar14]->m_External;
          if (bVar6) {
            if (iVar10 == 0) {
LAB_0019cadf:
              fVar15 = fVar18 + 14.0;
              if (fVar17 < fVar15) {
                bVar7 = false;
                goto LAB_0019cd3e;
              }
              bVar7 = fVar16 <= fVar18;
              fVar18 = fVar15;
              if (bVar7) {
                CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
                uVar9 = (ulong)(this->m_Map).m_lGroups.num_elements;
                if ((long)uVar9 < 1) {
                  bVar7 = false;
                }
                else {
                  uVar11 = 0;
                  bVar7 = false;
                  do {
                    if (!bVar7) {
                      pCVar3 = (this->m_Map).m_lGroups.list[uVar11];
                      uVar1 = (pCVar3->m_lLayers).num_elements;
                      if ((int)uVar1 < 1) {
                        uVar1 = 0;
                      }
                      uVar12 = 0;
                      do {
                        if (uVar1 == uVar12) break;
                        pCVar4 = (pCVar3->m_lLayers).list[uVar12];
                        iVar10 = pCVar4->m_Type;
                        if (iVar10 == 2) {
                          lVar13 = 0x30;
LAB_0019cb72:
                          if (uVar14 == *(uint *)(pCVar4->m_aName + lVar13 + -0x10)) {
                            bVar7 = true;
                          }
                        }
                        else if (iVar10 == 3) {
                          lVar13 = 0x28;
                          goto LAB_0019cb72;
                        }
                        uVar12 = uVar12 + 1;
                      } while (bVar7 == false);
                    }
                  } while ((bVar7 == false) && (uVar11 = uVar11 + 1, uVar11 < uVar9));
                }
                pID = (this->m_Map).m_lImages.list + uVar14;
                iVar10 = DoButton_Image(this,pID,(*pID)->m_aName,
                                        (uint)(uVar14 == (uint)this->m_SelectedImage),&Slot,1,
                                        "Select image",bVar7);
                if ((iVar10 != 0) && (this->m_SelectedImage = (int)uVar14, iVar10 == 2)) {
                  CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY
                                   ,0x78,0x50,this,PopupImage,0xf);
                }
                CUIRect::HSplitTop(&ToolBox_local,2.0,(CUIRect *)0x0,&ToolBox_local);
              }
            }
          }
          else if (iVar10 != 0) goto LAB_0019cadf;
          uVar14 = uVar14 + 1;
          fVar15 = fVar18;
        } while ((long)uVar14 < (long)(this->m_Map).m_lImages.num_elements);
      }
      fVar18 = fVar15 + 5.0;
      if (fVar18 <= fVar17) {
        CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
        local_68 = Slot.x;
        local_5c = Slot.h * 0.5 + Slot.y;
        local_64 = CONCAT44(Slot.x + Slot.w,local_5c);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
                  (this->m_pGraphics,0xffffffff);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                  (this->m_pGraphics,&local_68,1);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
        bVar7 = true;
      }
      else {
        bVar7 = false;
        fVar18 = fVar15;
      }
LAB_0019cd3e:
      if (!(bool)(bVar7 & bVar6)) {
        if (bVar7) {
          bVar5 = bVar6;
        }
        break;
      }
      fVar15 = fVar18 + 15.0;
      bVar7 = false;
      bVar5 = bVar6;
    } while (fVar15 <= fVar17);
    fVar18 = fVar18 + 17.0;
  }
  else {
    fVar18 = 17.0;
    bVar5 = true;
  }
  if ((!bVar5) && (fVar18 <= fVar17)) {
    CUIRect::HSplitTop(&ToolBox_local,5.0,&Slot,&ToolBox_local);
    CUIRect::HSplitTop(&ToolBox_local,12.0,&Slot,&ToolBox_local);
    iVar10 = DoButton_Editor(this,&RenderImagesList::s_NewImageButton,"Add",0,&Slot,0,
                             "Load a new image to use in the map");
    if (iVar10 != 0) {
      InvokeFileDialog(this,-1,1,"Add Image","Add","mapres","",AddImage,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderImagesList(CUIRect ToolBox)
{
	static float s_ScrollValue = 0.0f;
	const float RowHeight = 14.0f;
	const float HeaderHeight = RowHeight + 1.0f;
	const float HeaderSeparatorHeight = 5.0f;
	const float AddButtonHeight = 17.0f;
	const float ImagesHeight = 2 * (HeaderHeight + HeaderSeparatorHeight) + RowHeight * m_Map.m_lImages.size() + AddButtonHeight;
	const float ScrollDifference = maximum(ImagesHeight - ToolBox.h, 0.0f);

	if(ScrollDifference > 0) // Do we even need a scrollbar?
	{
		CUIRect Scroll;
		ToolBox.VSplitRight(15.0f, &ToolBox, &Scroll);
		ToolBox.VSplitRight(3.0f, &ToolBox, 0);	// extra spacing
		s_ScrollValue = UI()->DoScrollbarV(&s_ScrollValue, &Scroll, s_ScrollValue);
		if(UI()->MouseInside(&Scroll) || UI()->MouseInside(&ToolBox))
		{
			int ScrollNum = (int)((ImagesHeight-ToolBox.h)/RowHeight)+1;
			if(ScrollNum > 0)
			{
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_UP))
					s_ScrollValue = clamp(s_ScrollValue - 1.0f/ScrollNum, 0.0f, 1.0f);
				if(Input()->KeyPress(KEY_MOUSE_WHEEL_DOWN))
					s_ScrollValue = clamp(s_ScrollValue + 1.0f/ScrollNum, 0.0f, 1.0f);
			}
		}
	}
	else
		s_ScrollValue = 0.0f;

	const float ImageStartAt = ScrollDifference * s_ScrollValue;
	const float ImageStopAt = ImagesHeight + ScrollDifference * (s_ScrollValue - 1.0f);
	float ImageCur = 0.0f;

	for(int e = 0; e < 2; e++) // two passes, first embedded, then external
	{
		if(ImageCur + HeaderHeight > ImageStopAt)
			return;

		CUIRect Slot;
		if(ImageCur >= ImageStartAt)
		{
			ToolBox.HSplitTop(HeaderHeight, &Slot, &ToolBox);
			UI()->DoLabel(&Slot, e == 0 ? "Embedded" : "External", 12.0f, TEXTALIGN_CENTER);
		}
		ImageCur += HeaderHeight;

		for(int i = 0; i < m_Map.m_lImages.size(); i++)
		{
			if((e && !m_Map.m_lImages[i]->m_External) || (!e && m_Map.m_lImages[i]->m_External))
				continue;

			if(ImageCur + RowHeight > ImageStopAt)
				return;
			else if(ImageCur < ImageStartAt)
			{
				ImageCur += RowHeight;
				continue;
			}
			ImageCur += RowHeight;

			ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);

			// check if images is used
			bool Used = false;
			for(int g = 0; !Used && (g < m_Map.m_lGroups.size()); g++)
			{
				CLayerGroup *pGroup = m_Map.m_lGroups[g];
				for(int l = 0; !Used && l < pGroup->m_lLayers.size(); l++)
				{
					if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
					{
						CLayerTiles *pLayer = static_cast<CLayerTiles *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
					else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
					{
						CLayerQuads *pLayer = static_cast<CLayerQuads *>(pGroup->m_lLayers[l]);
						if(pLayer->m_Image == i)
							Used = true;
					}
				}
			}

			if(int Result = DoButton_Image(&m_Map.m_lImages[i], m_Map.m_lImages[i]->m_aName, m_SelectedImage == i, &Slot, BUTTON_CONTEXT, "Select image", Used))
			{
				m_SelectedImage = i;

				if(Result == 2)
					UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 80, this, PopupImage);
			}

			ToolBox.HSplitTop(2.0f, 0, &ToolBox);
		}

		// separator
		if(ImageCur + HeaderSeparatorHeight > ImageStopAt)
			return;
		ToolBox.HSplitTop(HeaderSeparatorHeight, &Slot, &ToolBox);
		ImageCur += HeaderSeparatorHeight;
		IGraphics::CLineItem LineItem(Slot.x, Slot.y+Slot.h/2, Slot.x+Slot.w, Slot.y+Slot.h/2);
		Graphics()->TextureClear();
		Graphics()->LinesBegin();
		Graphics()->LinesDraw(&LineItem, 1);
		Graphics()->LinesEnd();
	}

	if(ImageCur + AddButtonHeight > ImageStopAt)
		return;

	// new image
	static int s_NewImageButton = 0;
	CUIRect Slot;
	ToolBox.HSplitTop(5.0f, &Slot, &ToolBox);
	ToolBox.HSplitTop(12.0f, &Slot, &ToolBox);
	if(DoButton_Editor(&s_NewImageButton, "Add", 0, &Slot, 0, "Load a new image to use in the map"))
		InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_IMG, "Add Image", "Add", "mapres", "", AddImage, this);
}